

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile
          (ScanLineInputFile *this,Header *header,IStream *is,int numThreads)

{
  pointer puVar1;
  IStream *in;
  bool bVar2;
  int iVar3;
  Data *pDVar4;
  InputStreamMutex *pIVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  uchar b [8];
  int local_48;
  undefined4 uStack_44;
  LineOrder local_3c;
  undefined8 local_38;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__ScanLineInputFile_0303d0c0;
  pDVar4 = (Data *)operator_new(0x168);
  Data::Data(pDVar4,numThreads);
  this->_data = pDVar4;
  pIVar5 = (InputStreamMutex *)operator_new(0x38);
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pIVar5->is = (IStream *)0x0;
  *(undefined8 *)((long)&(pIVar5->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar5->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar5->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pIVar5->currentPosition = 0;
  this->_streamData = pIVar5;
  pIVar5->is = is;
  iVar3 = (*is->_vptr_IStream[2])(is);
  this->_data->memoryMapped = SUB41(iVar3,0);
  initialize(this,header);
  pDVar4 = this->_data;
  puVar1 = (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar10 = (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pDVar4->version = 0;
  in = this->_streamData->is;
  local_3c = pDVar4->lineOrder;
  if (puVar1 == puVar10) {
    uVar6 = 0;
  }
  else {
    uVar11 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar11;
      (*in->_vptr_IStream[3])(in,&local_48,8);
      puVar10[uVar9] = CONCAT44(uStack_44,local_48);
      puVar10 = (pDVar4->lineOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = (long)(pDVar4->lineOffsets).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
      uVar11 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (uVar8 < uVar6);
  }
  pDVar4->fileIsComplete = true;
  if (uVar6 != 0) {
    uVar11 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar11;
      if (puVar10[uVar9] == 0) {
        pDVar4->fileIsComplete = false;
        iVar3 = (*in->_vptr_IStream[5])(in);
        local_38 = CONCAT44(extraout_var,iVar3);
        if ((pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 0;
          uVar11 = 1;
          do {
            iVar3 = (*in->_vptr_IStream[5])(in);
            (*in->_vptr_IStream[3])(in,&local_48,4);
            (*in->_vptr_IStream[3])(in,&local_48,4);
            Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(in,local_48);
            if (local_3c == INCREASING_Y) {
              puVar1 = (pDVar4->lineOffsets).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar1[uVar6] = CONCAT44(extraout_var_00,iVar3);
              lVar7 = (long)(pDVar4->lineOffsets).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
            }
            else {
              puVar1 = (pDVar4->lineOffsets).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              lVar7 = (long)puVar1 -
                      (long)(pDVar4->lineOffsets).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              puVar1[~uVar6] = CONCAT44(extraout_var_00,iVar3);
            }
            bVar2 = uVar11 < (ulong)(lVar7 >> 3);
            uVar6 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar2);
        }
        (*in->_vptr_IStream[7])(in);
        (*in->_vptr_IStream[6])(in,local_38);
        return;
      }
      uVar11 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (uVar8 < uVar6);
  }
  return;
}

Assistant:

ScanLineInputFile::ScanLineInputFile
    (const Header &header,
     OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
     int numThreads)
:
    _data (new Data (numThreads)),
    _streamData (new InputStreamMutex())
{
    _streamData->is = is;
    _data->memoryMapped = is->isMemoryMapped();

    try
    {

        initialize(header);
        
        //
        // (TODO) this is nasty - we need a better way of working out what type of file has been used.
        // in any case I believe this constructor only gets used with single part files
        // and 'version' currently only tracks multipart state, so setting to 0 (not multipart) works for us
        //
        
        _data->version=0;
        readLineOffsets (*_streamData->is,
                        _data->lineOrder,
                        _data->lineOffsets,
                        _data->fileIsComplete);
    }
    catch(...)
    {
        if(_data)
        {
           if (!_data->memoryMapped)
           {
              for (size_t i = 0; i < _data->lineBuffers.size(); i++)
              {
                 if( _data->lineBuffers[i] )
                 {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                 }
              }
           }
        }
        delete _streamData;
        delete _data;
        throw;
    }
}